

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::anon_unknown_0::safe_parse_positive_int<unsigned_long>
          (anon_unknown_0 *this,string_view text,int base,Nonnull<unsigned_long_*> value_p)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  size_type sVar4;
  const_pointer pvVar5;
  const_reference pvVar6;
  ulong uVar7;
  undefined4 in_register_0000000c;
  unsigned_long *puVar8;
  int iVar9;
  bool bVar10;
  unsigned_long digit;
  uchar c;
  char *end;
  char *start;
  unsigned_long vmax_over_base;
  unsigned_long base_inttype;
  unsigned_long vmax;
  unsigned_long value;
  Nonnull<unsigned_long_*> value_p_local;
  undefined1 auStack_20 [4];
  int base_local;
  string_view text_local;
  
  puVar8 = (unsigned_long *)CONCAT44(in_register_0000000c,base);
  text_local._M_len = text._M_len;
  iVar9 = (int)text._M_str;
  vmax = 0;
  _auStack_20 = this;
  if (iVar9 < 0) {
    __assert_fail("base >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                  ,0x3db,
                  "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned long]"
                 );
  }
  uVar2 = (ulong)iVar9;
  uVar1 = *(ulong *)(lts_20250127::(anonymous_namespace)::LookupTables<unsigned_long>::kVmaxOverBase
                    + (long)iVar9 * 8);
  bVar10 = true;
  if (1 < iVar9) {
    uVar3 = std::numeric_limits<unsigned_long>::max();
    bVar10 = uVar3 / uVar2 == uVar1;
  }
  if (!bVar10) {
    __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/numbers.cc"
                  ,0x3e0,
                  "bool absl::lts_20250127::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned long]"
                 );
  }
  end = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  pvVar5 = end + sVar4;
  while( true ) {
    if (pvVar5 <= end) {
      *puVar8 = vmax;
      return true;
    }
    pvVar6 = std::array<signed_char,_256UL>::operator[]
                       ((array<signed_char,_256UL> *)
                        lts_20250127::(anonymous_namespace)::kAsciiToInt,(ulong)(byte)*end);
    uVar7 = (ulong)*pvVar6;
    if (uVar2 <= uVar7) {
      *puVar8 = vmax;
      return false;
    }
    if (uVar1 < vmax) {
      *puVar8 = 0xffffffffffffffff;
      return false;
    }
    if (-uVar7 - 1 < uVar2 * vmax) break;
    vmax = uVar7 + uVar2 * vmax;
    end = end + 1;
  }
  *puVar8 = 0xffffffffffffffff;
  return false;
}

Assistant:

inline bool safe_parse_positive_int(absl::string_view text, int base,
                                    absl::Nonnull<IntType*> value_p) {
  IntType value = 0;
  const IntType vmax = std::numeric_limits<IntType>::max();
  assert(vmax > 0);
  assert(base >= 0);
  const IntType base_inttype = static_cast<IntType>(base);
  assert(vmax >= base_inttype);
  const IntType vmax_over_base = LookupTables<IntType>::kVmaxOverBase[base];
  assert(base < 2 ||
         std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base);
  const char* start = text.data();
  const char* end = start + text.size();
  // loop over digits
  for (; start < end; ++start) {
    unsigned char c = static_cast<unsigned char>(start[0]);
    IntType digit = static_cast<IntType>(kAsciiToInt[c]);
    if (digit >= base_inttype) {
      *value_p = value;
      return false;
    }
    if (value > vmax_over_base) {
      *value_p = vmax;
      return false;
    }
    value *= base_inttype;
    if (value > vmax - digit) {
      *value_p = vmax;
      return false;
    }
    value += digit;
  }
  *value_p = value;
  return true;
}